

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O1

void __thiscall
cmComputeTargetDepends::CollectTargetDepends(cmComputeTargetDepends *this,int depender_index)

{
  cmGeneratorTarget *this_00;
  pointer pcVar1;
  pointer pcVar2;
  cmMakefile *this_01;
  size_type sVar3;
  bool bVar4;
  cmLinkImplementation *pcVar5;
  string *sourceName;
  cmSourceFile *o;
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *psVar6;
  _Base_ptr p_Var7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *__range3;
  _Rb_tree_header *p_Var9;
  cmLinkImplItem *lib;
  pointer __v;
  pointer this_02;
  _Alloc_hider _Var10;
  pair<std::_Rb_tree_iterator<cmLinkItem>,_bool> pVar11;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectFiles;
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> emitted;
  string *local_110;
  cmLinkItem local_108;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_c8;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_b8;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_a8;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_98;
  string *local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
  local_60;
  
  this_00 = (this->Targets).
            super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
            ._M_impl.super__Vector_impl_data._M_start[depender_index];
  bVar4 = cmGeneratorTarget::IsInBuildSystem(this_00);
  if (bVar4) {
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    cmMakefile::GetGeneratorConfigs_abi_cxx11_(&local_78,this_00->Makefile,IncludeEmptyConfig);
    local_110 = local_78.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_80 = local_78.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        paVar8 = &local_108.String.field_2;
        local_c8.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_c8.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_c8);
        cmLinkItem::cmLinkItem(&local_108,this_00,false,(cmListFileBacktrace *)&local_c8);
        std::
        _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
        ::_M_insert_unique<cmLinkItem>(&local_60,&local_108);
        if (local_108.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_108.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                     TopEntry.
                     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108.String._M_dataplus._M_p != paVar8) {
          operator_delete(local_108.String._M_dataplus._M_p,
                          local_108.String.field_2._M_allocated_capacity + 1);
        }
        if (local_c8.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_c8.TopEntry.
                     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        local_98.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_98.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_98);
        cmLinkItem::cmLinkItem(&local_108,this_00,true,(cmListFileBacktrace *)&local_98);
        std::
        _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
        ::_M_insert_unique<cmLinkItem>(&local_60,&local_108);
        if (local_108.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_108.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                     TopEntry.
                     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108.String._M_dataplus._M_p != paVar8) {
          operator_delete(local_108.String._M_dataplus._M_p,
                          local_108.String.field_2._M_allocated_capacity + 1);
        }
        if (local_98.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_98.TopEntry.
                     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        pcVar5 = cmGeneratorTarget::GetLinkImplementation(this_00,local_110,Link);
        if (pcVar5 != (cmLinkImplementation *)0x0) {
          pcVar1 = (pcVar5->super_cmLinkImplementationLibraries).Libraries.
                   super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (__v = (pcVar5->super_cmLinkImplementationLibraries).Libraries.
                     super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                     super__Vector_impl_data._M_start; __v != pcVar1; __v = __v + 1) {
            pVar11 = std::
                     _Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
                     ::_M_insert_unique<cmLinkItem_const&>
                               ((_Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
                                 *)&local_60,&__v->super_cmLinkItem);
            if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              AddTargetDepend(this,depender_index,&__v->super_cmLinkItem,true,false);
              AddInterfaceDepends(this,depender_index,&__v->super_cmLinkItem,local_110,
                                  (set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
                                   *)&local_60);
            }
          }
          pcVar2 = (pcVar5->super_cmLinkImplementationLibraries).Objects.
                   super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (this_02 = (pcVar5->super_cmLinkImplementationLibraries).Objects.
                         super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                         super__Vector_impl_data._M_start; this_02 != pcVar2; this_02 = this_02 + 1)
          {
            this_01 = this_00->Makefile;
            sourceName = cmLinkItem::AsStr_abi_cxx11_(this_02);
            o = cmMakefile::GetSource(this_01,sourceName,Known);
            if (o != (cmSourceFile *)0x0) {
              AddObjectDepends(this,depender_index,o,
                               (set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
                                *)&local_60);
            }
          }
        }
        local_108.String._M_dataplus._M_p = (pointer)0x0;
        local_108.String._M_string_length = 0;
        local_108.String.field_2._M_allocated_capacity = 0;
        cmGeneratorTarget::GetExternalObjects
                  (this_00,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                           &local_108,local_110);
        sVar3 = local_108.String._M_string_length;
        for (_Var10._M_p = local_108.String._M_dataplus._M_p; _Var10._M_p != (pointer)sVar3;
            _Var10._M_p = _Var10._M_p + 8) {
          AddObjectDepends(this,depender_index,*(cmSourceFile **)_Var10._M_p,
                           (set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)
                           &local_60);
        }
        if (local_108.String._M_dataplus._M_p != (pointer)0x0) {
          operator_delete(local_108.String._M_dataplus._M_p,
                          local_108.String.field_2._M_allocated_capacity -
                          (long)local_108.String._M_dataplus._M_p);
        }
        local_110 = local_110 + 1;
      } while (local_110 != local_80);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_78);
    std::
    _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
    ::~_Rb_tree(&local_60);
    psVar6 = cmGeneratorTarget::GetUtilityItems(this_00);
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_a8.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_a8.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_a8);
    cmLinkItem::cmLinkItem(&local_108,this_00,false,(cmListFileBacktrace *)&local_a8);
    std::
    _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
    ::_M_insert_unique<cmLinkItem>(&local_60,&local_108);
    if (local_108.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_108.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                 TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    paVar8 = &local_108.String.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108.String._M_dataplus._M_p != paVar8) {
      operator_delete(local_108.String._M_dataplus._M_p,
                      local_108.String.field_2._M_allocated_capacity + 1);
    }
    if (local_a8.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    local_b8.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_b8.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_b8);
    cmLinkItem::cmLinkItem(&local_108,this_00,true,(cmListFileBacktrace *)&local_b8);
    std::
    _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
    ::_M_insert_unique<cmLinkItem>(&local_60,&local_108);
    if (local_108.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_108.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                 TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108.String._M_dataplus._M_p != paVar8) {
      operator_delete(local_108.String._M_dataplus._M_p,
                      local_108.String.field_2._M_allocated_capacity + 1);
    }
    if (local_b8.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b8.TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    p_Var7 = (psVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var9 = &(psVar6->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var7 != p_Var9) {
      do {
        pVar11 = std::
                 _Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
                 ::_M_insert_unique<cmLinkItem_const&>
                           ((_Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
                             *)&local_60,(cmLinkItem *)(p_Var7 + 1));
        if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          AddTargetDepend(this,depender_index,(cmLinkItem *)(p_Var7 + 1),false,
                          *(bool *)&p_Var7[2]._M_parent);
        }
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      } while ((_Rb_tree_header *)p_Var7 != p_Var9);
    }
    std::
    _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
    ::~_Rb_tree(&local_60);
  }
  return;
}

Assistant:

void cmComputeTargetDepends::CollectTargetDepends(int depender_index)
{
  // Get the depender.
  cmGeneratorTarget const* depender = this->Targets[depender_index];
  if (!depender->IsInBuildSystem()) {
    return;
  }

  // Loop over all targets linked directly in all configs.
  // We need to make targets depend on the union of all config-specific
  // dependencies in all targets, because the generated build-systems can't
  // deal with config-specific dependencies.
  {
    std::set<cmLinkItem> emitted;

    std::vector<std::string> const& configs =
      depender->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);
    for (std::string const& it : configs) {
      // A target should not depend on itself.
      emitted.insert(cmLinkItem(depender, false, cmListFileBacktrace()));
      emitted.insert(cmLinkItem(depender, true, cmListFileBacktrace()));

      if (cmLinkImplementation const* impl = depender->GetLinkImplementation(
            it, cmGeneratorTarget::LinkInterfaceFor::Link)) {
        for (cmLinkImplItem const& lib : impl->Libraries) {
          // Don't emit the same library twice for this target.
          if (emitted.insert(lib).second) {
            this->AddTargetDepend(depender_index, lib, true, false);
            this->AddInterfaceDepends(depender_index, lib, it, emitted);
          }
        }
        for (cmLinkItem const& obj : impl->Objects) {
          if (cmSourceFile const* o = depender->Makefile->GetSource(
                obj.AsStr(), cmSourceFileLocationKind::Known)) {
            this->AddObjectDepends(depender_index, o, emitted);
          }
        }
      }

      // Add dependencies on object libraries not otherwise handled above.
      std::vector<cmSourceFile const*> objectFiles;
      depender->GetExternalObjects(objectFiles, it);
      for (cmSourceFile const* o : objectFiles) {
        this->AddObjectDepends(depender_index, o, emitted);
      }
    }
  }

  // Loop over all utility dependencies.
  {
    std::set<cmLinkItem> const& tutils = depender->GetUtilityItems();
    std::set<cmLinkItem> emitted;
    // A target should not depend on itself.
    emitted.insert(cmLinkItem(depender, false, cmListFileBacktrace()));
    emitted.insert(cmLinkItem(depender, true, cmListFileBacktrace()));
    for (cmLinkItem const& litem : tutils) {
      // Don't emit the same utility twice for this target.
      if (emitted.insert(litem).second) {
        this->AddTargetDepend(depender_index, litem, false, litem.Cross);
      }
    }
  }
}